

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

int cal_mb_wiener_var_hook(void *arg1,void *unused)

{
  byte bVar1;
  long *plVar2;
  long lVar3;
  pthread_mutex_t *__mutex;
  int iVar4;
  long *in_RDI;
  int has_jobs;
  int current_mi_row;
  double sum_est_rate;
  double sum_rec_distortion;
  tran_low_t dqcoeff [1024];
  tran_low_t qcoeff [1024];
  tran_low_t coeff [1024];
  int16_t src_diff [1024];
  aom_internal_error_info *error_info;
  pthread_mutex_t *enc_row_mt_mutex;
  AV1EncRowMultiThreadInfo *enc_row_mt;
  AV1EncRowMultiThreadSync *intra_row_mt_sync;
  int mb_step;
  BLOCK_SIZE bsize;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  AV1_COMP *cpi;
  EncWorkerData *thread_data;
  AV1_COMP *in_stack_ffffffffffffc748;
  int local_389c;
  int local_3894 [157];
  tran_low_t *in_stack_ffffffffffffc9e0;
  int16_t *in_stack_ffffffffffffc9e8;
  int in_stack_ffffffffffffc9f4;
  MACROBLOCKD *in_stack_ffffffffffffc9f8;
  MACROBLOCK *in_stack_ffffffffffffca00;
  AV1_COMP *in_stack_ffffffffffffca08;
  tran_low_t *in_stack_ffffffffffffca28;
  tran_low_t *in_stack_ffffffffffffca30;
  double *in_stack_ffffffffffffca38;
  double *in_stack_ffffffffffffca40;
  uint8_t *in_stack_ffffffffffffca48;
  int local_24;
  
  plVar2 = (long *)*in_RDI;
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [*(byte *)(plVar2 + 0x13abf)];
  lVar3 = *plVar2;
  __mutex = (pthread_mutex_t *)plVar2[0x135f7];
  *(long **)(in_RDI[1] + 0x2b90) = in_RDI + 3;
  iVar4 = _setjmp((__jmp_buf_tag *)(in_RDI + 0x1e));
  if (iVar4 == 0) {
    *(undefined4 *)(in_RDI + 0x1d) = 1;
    local_3894[3] = 0;
    local_3894[4] = 0;
    local_3894[1] = 0;
    local_3894[2] = 0;
    while( true ) {
      local_3894[0] = -1;
      pthread_mutex_lock(__mutex);
      if ((*(byte *)((long)plVar2 + 0x9afb6) & 1) == 0) {
        local_389c = get_next_job_allintra
                               ((AV1EncRowMultiThreadSync *)(lVar3 + 0x14e08),
                                *(int *)((long)plVar2 + 0x3c194),local_3894,(uint)bVar1);
      }
      else {
        local_389c = 0;
      }
      pthread_mutex_unlock(__mutex);
      if (local_389c == 0) break;
      av1_calc_mb_wiener_var_row
                (in_stack_ffffffffffffca08,in_stack_ffffffffffffca00,in_stack_ffffffffffffc9f8,
                 in_stack_ffffffffffffc9f4,in_stack_ffffffffffffc9e8,in_stack_ffffffffffffc9e0,
                 in_stack_ffffffffffffca28,in_stack_ffffffffffffca30,in_stack_ffffffffffffca38,
                 in_stack_ffffffffffffca40,in_stack_ffffffffffffca48);
      pthread_mutex_lock(__mutex);
      *(int *)(lVar3 + 0x14e30) = *(int *)(lVar3 + 0x14e30) + -1;
      pthread_mutex_unlock(__mutex);
    }
    *(undefined4 *)(in_RDI + 0x1d) = 0;
    local_24 = 1;
  }
  else {
    *(undefined4 *)(in_RDI + 0x1d) = 0;
    pthread_mutex_lock(__mutex);
    *(undefined1 *)((long)plVar2 + 0x9afb6) = 1;
    pthread_mutex_unlock(__mutex);
    set_mb_wiener_var_calc_done(in_stack_ffffffffffffc748);
    local_24 = 0;
  }
  return local_24;
}

Assistant:

static int cal_mb_wiener_var_hook(void *arg1, void *unused) {
  (void)unused;
  EncWorkerData *const thread_data = (EncWorkerData *)arg1;
  AV1_COMP *const cpi = thread_data->cpi;
  MACROBLOCK *x = &thread_data->td->mb;
  MACROBLOCKD *xd = &x->e_mbd;
  const BLOCK_SIZE bsize = cpi->weber_bsize;
  const int mb_step = mi_size_wide[bsize];
  AV1EncRowMultiThreadSync *const intra_row_mt_sync =
      &cpi->ppi->intra_row_mt_sync;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &cpi->mt_info.enc_row_mt;
  (void)enc_row_mt;
#if CONFIG_MULTITHREAD
  pthread_mutex_t *enc_row_mt_mutex = enc_row_mt->mutex_;
#endif

  struct aom_internal_error_info *const error_info = &thread_data->error_info;
  xd->error_info = error_info;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex);
    enc_row_mt->mb_wiener_mt_exit = true;
    pthread_mutex_unlock(enc_row_mt_mutex);
#endif
    set_mb_wiener_var_calc_done(cpi);
    return 0;
  }
  error_info->setjmp = 1;
  DECLARE_ALIGNED(32, int16_t, src_diff[32 * 32]);
  DECLARE_ALIGNED(32, tran_low_t, coeff[32 * 32]);
  DECLARE_ALIGNED(32, tran_low_t, qcoeff[32 * 32]);
  DECLARE_ALIGNED(32, tran_low_t, dqcoeff[32 * 32]);
  double sum_rec_distortion = 0;
  double sum_est_rate = 0;
  while (1) {
    int current_mi_row = -1;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex);
#endif
    int has_jobs = enc_row_mt->mb_wiener_mt_exit
                       ? 0
                       : get_next_job_allintra(intra_row_mt_sync,
                                               cpi->common.mi_params.mi_rows,
                                               &current_mi_row, mb_step);
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(enc_row_mt_mutex);
#endif
    if (!has_jobs) break;
    // TODO(chengchen): properly accumulate the distortion and rate.
    av1_calc_mb_wiener_var_row(cpi, x, xd, current_mi_row, src_diff, coeff,
                               qcoeff, dqcoeff, &sum_rec_distortion,
                               &sum_est_rate,
                               thread_data->td->wiener_tmp_pred_buf);
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex);
#endif
    intra_row_mt_sync->num_threads_working--;
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(enc_row_mt_mutex);
#endif
  }
  error_info->setjmp = 0;
  return 1;
}